

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawWallAddClamp1PalCommand::Execute
          (DrawWallAddClamp1PalCommand *this,DrawerThread *thread)

{
  byte bVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  int pitch_00;
  int iVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uchar *dest_00;
  uint32_t *puVar8;
  uint32_t *puVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint32_t b;
  uint32_t a;
  uint8_t pix;
  uint32_t *bg2rgb;
  uint32_t *fg2rgb;
  int pitch;
  int bits;
  uint8_t *dest;
  uint8_t *source;
  int count;
  uint8_t *colormap;
  uint32_t frac;
  uint32_t fracstep;
  DrawerThread *thread_local;
  DrawWallAddClamp1PalCommand *this_local;
  
  iVar2 = *(int *)&(this->super_PalWall1Command).super_DrawerCommand.field_0xc;
  uVar3 = (this->super_PalWall1Command)._texturefrac;
  puVar6 = (this->super_PalWall1Command)._colormap;
  puVar7 = (this->super_PalWall1Command)._source;
  dest_00 = (this->super_PalWall1Command)._dest;
  iVar4 = (this->super_PalWall1Command)._fracbits;
  pitch_00 = (this->super_PalWall1Command)._pitch;
  puVar8 = (this->super_PalWall1Command)._srcblend;
  puVar9 = (this->super_PalWall1Command)._destblend;
  source._4_4_ = DrawerThread::count_for_thread
                           (thread,(this->super_PalWall1Command).super_DrawerCommand._dest_y,
                            (this->super_PalWall1Command)._count);
  if (0 < source._4_4_) {
    _pitch = DrawerThread::dest_for_thread<unsigned_char>
                       (thread,(this->super_PalWall1Command).super_DrawerCommand._dest_y,pitch_00,
                        dest_00);
    iVar10 = DrawerThread::skipped_by_thread
                       (thread,(this->super_PalWall1Command).super_DrawerCommand._dest_y);
    colormap._0_4_ = iVar2 * iVar10 + uVar3;
    iVar10 = thread->num_cores;
    iVar5 = thread->num_cores;
    do {
      bVar1 = puVar7[(uint)colormap >> ((byte)iVar4 & 0x1f)];
      if (bVar1 != 0) {
        uVar11 = puVar8[puVar6[bVar1]] + puVar9[*_pitch];
        uVar12 = uVar11 & 0x40100400;
        uVar11 = uVar12 - (uVar12 >> 5) | uVar11 & 0x3fffffff | 0x1f07c1f;
        *_pitch = RGB32k.All[uVar11 & uVar11 >> 0xf];
      }
      colormap._0_4_ = iVar10 * iVar2 + (uint)colormap;
      _pitch = _pitch + iVar5 * pitch_00;
      source._4_4_ = source._4_4_ + -1;
    } while (source._4_4_ != 0);
  }
  return;
}

Assistant:

void DrawWallAddClamp1PalCommand::Execute(DrawerThread *thread)
	{
		uint32_t fracstep = _iscale;
		uint32_t frac = _texturefrac;
		uint8_t *colormap = _colormap;
		int count = _count;
		const uint8_t *source = _source;
		uint8_t *dest = _dest;
		int bits = _fracbits;
		int pitch = _pitch;

		uint32_t *fg2rgb = _srcblend;
		uint32_t *bg2rgb = _destblend;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * thread->skipped_by_thread(_dest_y);
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		do
		{
			uint8_t pix = source[frac >> bits];
			if (pix != 0)
			{
				uint32_t a = fg2rgb[colormap[pix]] + bg2rgb[*dest];
				uint32_t b = a;

				a |= 0x01f07c1f;
				b &= 0x40100400;
				a &= 0x3fffffff;
				b = b - (b >> 5);
				a |= b;
				*dest = RGB32k.All[a & (a >> 15)];
			}
			frac += fracstep;
			dest += pitch;
		} while (--count);
	}